

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive-solver.hpp
# Opt level: O1

int __thiscall
baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,float>::
solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[]>>>
          (exhaustive_solver<baryonyx::itm::maximize_tag,float> *this,int k,
          unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
          *reduced_cost,int r_size)

{
  exhaustive_solver<baryonyx::itm::maximize_tag,float> *peVar1;
  long lVar2;
  item *piVar3;
  uint uVar4;
  ulong uVar5;
  __normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_float>::item_*,_std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_float>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_float>::item>_>_>
  _Var6;
  exhaustive_solver<baryonyx::itm::maximize_tag,float> *peVar7;
  int *piVar8;
  long lVar9;
  rc_data *prVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  int *piVar15;
  ulong uVar16;
  ulong uVar17;
  size_type __new_size;
  exhaustive_solver<baryonyx::itm::maximize_tag,float> *peVar18;
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  
  peVar1 = this + 0x50;
  peVar7 = peVar1;
  for (peVar18 = *(exhaustive_solver<baryonyx::itm::maximize_tag,float> **)(this + 0x58);
      peVar18 != (exhaustive_solver<baryonyx::itm::maximize_tag,float> *)0x0;
      peVar18 = *(exhaustive_solver<baryonyx::itm::maximize_tag,float> **)
                 (peVar18 + (ulong)(*(int *)(peVar18 + 0x20) < k) * 8 + 0x10)) {
    if (k <= *(int *)(peVar18 + 0x20)) {
      peVar7 = peVar18;
    }
  }
  peVar18 = peVar1;
  if ((peVar7 != peVar1) && (peVar18 = peVar7, k < *(int *)(peVar7 + 0x20))) {
    peVar18 = peVar1;
  }
  if (peVar18 != peVar1) {
    __new_size = (size_type)r_size;
    std::
    vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_float>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_float>::item>_>
    ::resize((vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_float>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_float>::item>_>
              *)this,__new_size);
    uVar5 = (ulong)(uint)r_size;
    if (r_size != 0) {
      lVar9 = *(long *)this;
      piVar8 = &((reduced_cost->_M_t).
                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data_*,_false>
                ._M_head_impl)->f;
      lVar13 = 0;
      do {
        *(float *)(lVar9 + lVar13) = ((rc_data *)(piVar8 + -2))->value;
        *(int *)(lVar9 + 8 + lVar13) = piVar8[-1];
        *(int *)(lVar9 + 4 + lVar13) = *piVar8;
        *(undefined4 *)(lVar9 + 0xc + lVar13) = 0;
        piVar8 = piVar8 + 3;
        lVar13 = lVar13 + 0x10;
      } while (uVar5 << 4 != lVar13);
    }
    lVar9 = (long)*(int *)(peVar18 + 0x24);
    if (r_size == 0) {
      auVar19 = ZEXT864(0);
    }
    else {
      prVar10 = (reduced_cost->_M_t).
                super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
                .
                super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data_*,_false>
                ._M_head_impl;
      auVar19 = ZEXT864(0);
      uVar14 = 0;
      do {
        if (*(int *)(lVar9 * 4 + *(long *)(this + 0x18) + uVar14 * 4) != 0) {
          auVar19 = ZEXT464((uint)(auVar19._0_4_ + prVar10->value));
        }
        uVar14 = uVar14 + 1;
        prVar10 = prVar10 + 1;
      } while (uVar5 != uVar14);
    }
    iVar11 = 0;
    if ((ulong)*(uint *)(peVar18 + 0x28) != 1) {
      lVar13 = lVar9 * 4 + __new_size * 4 + *(long *)(this + 0x18);
      uVar14 = 0;
      uVar16 = 1;
      do {
        auVar20 = ZEXT816(0) << 0x40;
        auVar21 = ZEXT1664(auVar20);
        if (r_size != 0) {
          uVar17 = 0;
          prVar10 = (reduced_cost->_M_t).
                    super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
                    .
                    super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data_*,_false>
                    ._M_head_impl;
          do {
            if (*(int *)(lVar13 + uVar17 * 4) != 0) {
              auVar21 = ZEXT464((uint)(auVar21._0_4_ + prVar10->value));
            }
            auVar20 = auVar21._0_16_;
            uVar17 = uVar17 + 1;
            prVar10 = prVar10 + 1;
          } while (uVar5 != uVar17);
        }
        if (auVar19._0_4_ < auVar20._0_4_) {
          uVar14 = uVar16 & 0xffffffff;
        }
        iVar11 = (int)uVar14;
        auVar20 = vmaxss_avx(auVar20,auVar19._0_16_);
        auVar19 = ZEXT1664(auVar20);
        uVar16 = uVar16 + 1;
        lVar13 = lVar13 + __new_size * 4;
      } while (uVar16 != *(uint *)(peVar18 + 0x28));
    }
    if (r_size != 0) {
      lVar13 = *(long *)this;
      lVar2 = *(long *)(this + 0x18);
      lVar12 = 0;
      do {
        *(uint *)(lVar13 + 0xc + lVar12 * 4) =
             (uint)(*(int *)((iVar11 * r_size + lVar9) * 4 + lVar2 + lVar12) != 0);
        lVar12 = lVar12 + 4;
      } while (uVar5 << 2 != lVar12);
    }
    lVar9 = *(long *)this;
    lVar13 = *(long *)(this + 8);
    if (lVar9 != lVar13) {
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,float>::item*,std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,float>::item,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,float>::item>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,float>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[]>>>(int,std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[]>>&,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                (lVar9,lVar13,(int)LZCOUNT(lVar13 - lVar9 >> 4) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,float>::item*,std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,float>::item,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,float>::item>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,float>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[]>>>(int,std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[]>>&,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                (lVar9,lVar13);
    }
    _Var6 = std::
            __find_if<__gnu_cxx::__normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,float>::item*,std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,float>::item,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,float>::item>>>,__gnu_cxx::__ops::_Iter_pred<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,float>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[]>>>(int,std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[]>>&,int)::_lambda(auto:1_const&)_1_>>
                      (*(undefined8 *)this,*(undefined8 *)(this + 8));
    lVar9 = *(long *)this;
    piVar3 = *(item **)(this + 8);
    lVar13 = (long)piVar3 - lVar9;
    if (lVar13 != 0) {
      lVar13 = lVar13 >> 4;
      piVar8 = (int *)(lVar9 + 8);
      piVar15 = &((reduced_cost->_M_t).
                  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
                  .
                  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data_*,_false>
                 ._M_head_impl)->f;
      do {
        ((rc_data *)(piVar15 + -2))->value = (float)piVar8[-2];
        piVar15[-1] = *piVar8;
        *piVar15 = piVar8[-1];
        piVar8 = piVar8 + 4;
        piVar15 = piVar15 + 3;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    if (_Var6._M_current == piVar3) {
      uVar4 = -(uint)(*(int *)(lVar9 + 0xc) == 0) | r_size;
    }
    else {
      uVar4 = (int)((ulong)((long)_Var6._M_current - lVar9) >> 4) - 1;
    }
    return uVar4;
  }
  solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[]>>>
            ();
}

Assistant:

int solve(int k, R& reduced_cost, int r_size)
    {
        const auto it_constraint = constraints.find(k);
        bx_expects(it_constraint != constraints.end());

        items.resize(r_size);
        for (int i = 0; i != r_size; ++i) {
            items[i].r = reduced_cost[i].value;
            items[i].variable = reduced_cost[i].id;
            items[i].factor = reduced_cost[i].f;
            items[i].result = 0;
        }

        Float z_best = 0;
        auto best = 0;
        auto start_solution = it_constraint->start;

        for (int j = 0; j != r_size; ++j)
            if (flat_constraints[start_solution + j])
                z_best += reduced_cost[j].value;

        for (auto i = 1; i != it_constraint->solutions; ++i) {
            start_solution = it_constraint->start + (i * r_size);

            Float z = 0;
            for (int j = 0; j != r_size; ++j)
                if (flat_constraints[start_solution + j])
                    z += reduced_cost[j].value;

            if (is_best_solution(z, z_best)) {
                z_best = z;
                best = i;
            }
        }

        start_solution = it_constraint->start + (best * r_size);
        for (int i = 0; i != r_size; ++i)
            items[i].result = flat_constraints[start_solution + i] ? 1 : 0;

        std::sort(std::begin(items),
                  std::end(items),
                  [](const auto& lhs, const auto& rhs) {
                      if (lhs.result == rhs.result) {
                          if constexpr (std::is_same_v<Mode, minimize_tag>)
                              return lhs.r < rhs.r;
                          else
                              return lhs.r > rhs.r;
                      } else
                          return lhs.result > rhs.result;
                  });

        auto middle =
          std::find_if(std::begin(items),
                       std::end(items),
                       [](const auto& item) { return item.result == 0; });

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            reduced_cost[i].value = items[i].r;
            reduced_cost[i].id = items[i].variable;
            reduced_cost[i].f = items[i].factor;
        }

        if (middle == std::end(items))
            return items[0].result == 0 ? -1 : r_size;

        return static_cast<int>(std::distance(std::begin(items), middle) - 1);
    }